

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *beta,SampledSpectrum *pathPDF)

{
  Point3<float> args;
  Vector3<float> args_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  LightSampleContext ctx_00;
  undefined1 auVar4 [16];
  Vector3f wiRender;
  undefined1 auVar5 [16];
  anon_class_32_4_b07b4888 func;
  undefined1 auVar6 [16];
  SampledWavelengths lambda_00;
  Vector3f woRender;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3f wiRender_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f woRender_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  array<float,_4> aVar23;
  bool bVar24;
  LightType type;
  SurfaceInteraction *pSVar25;
  SampledLight *pSVar26;
  ShapeIntersection *pSVar27;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_R9;
  Point2f PVar28;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [56];
  SampledSpectrum SVar34;
  Float tMax;
  optional<pbrt::ShapeIntersection> si;
  RNG rng;
  SampledSpectrum pdfUni;
  SampledSpectrum pdfLight;
  SampledSpectrum throughput;
  Ray lightRay;
  PhaseFunctionHandle phase;
  Vector3f wi;
  Vector3f wo;
  SampledSpectrum betaLight;
  Float scatterPDF;
  Float lightPDF;
  LightLiSample ls;
  LightSampleContext ctx;
  LightHandle light;
  Point2f uLight;
  optional<pbrt::SampledLight> sampledLight;
  Float u;
  undefined1 auVar35 [16];
  undefined1 auVar37 [20];
  undefined1 auVar40 [12];
  undefined1 in_stack_fffffffffffff778 [32];
  undefined1 auVar36 [32];
  undefined1 auVar38 [24];
  undefined1 auVar39 [28];
  undefined8 in_stack_fffffffffffff798;
  Float u_00;
  Integrator *this_00;
  LightSampleContext *in_stack_fffffffffffff7a0;
  LightSamplerHandle *in_stack_fffffffffffff7a8;
  float fVar41;
  char (*in_stack_fffffffffffff7c0) [43];
  char (*args_01) [27];
  char *in_stack_fffffffffffff7c8;
  undefined4 uStack_830;
  int in_stack_fffffffffffff7d4;
  undefined4 in_stack_fffffffffffff7d8;
  LightSamplingMode in_stack_fffffffffffff7dc;
  undefined4 in_stack_fffffffffffff7e0;
  LogLevel in_stack_fffffffffffff7e4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  BxDFReflTransFlags in_stack_fffffffffffff7f8;
  TransportMode in_stack_fffffffffffff7fc;
  undefined4 in_stack_fffffffffffff800;
  Float in_stack_fffffffffffff804;
  Ray *in_stack_fffffffffffff808;
  MediumHandle *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff818;
  float in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  RNG *in_stack_fffffffffffff838;
  float in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff848;
  float in_stack_fffffffffffff84c;
  BSDF *in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff868;
  float in_stack_fffffffffffff870;
  undefined4 uStack_78c;
  undefined8 in_stack_fffffffffffff888;
  float in_stack_fffffffffffff890;
  undefined4 uStack_76c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_4e8;
  optional local_4e0 [264];
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined4 local_350;
  undefined8 local_34c;
  undefined4 local_344;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_338 [2];
  Tuple3<pbrt::Vector3,_float> local_328;
  undefined8 local_318;
  undefined4 local_310;
  Tuple3<pbrt::Vector3,_float> local_308;
  undefined8 local_2f8;
  undefined4 local_2f0;
  Tuple3<pbrt::Vector3,_float> local_2e8;
  undefined8 local_2d8;
  undefined4 local_2d0;
  Tuple3<pbrt::Vector3,_float> local_2c8;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  Tuple3<pbrt::Vector3,_float> local_288;
  undefined8 local_27c;
  undefined4 local_274;
  undefined8 local_270;
  undefined8 local_268;
  Float local_260;
  float local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  char (*pacStack_240) [27];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Integrator *pIStack_208;
  PhaseFunctionHandle *pPStack_200;
  LightLiSample local_1f0;
  undefined1 local_178 [48];
  LightSampleContext local_148;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  Integrator *pIStack_f8;
  PhaseFunctionHandle *pPStack_f0;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_e8;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_e0;
  int local_d8;
  undefined8 local_c8;
  LightSampleContext local_90;
  optional local_60 [28];
  Float local_44;
  undefined8 *local_40;
  undefined8 *local_30;
  long local_28;
  long local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  u_00 = (Float)((ulong)in_stack_fffffffffffff798 >> 0x20);
  auVar35 = in_stack_fffffffffffff778._0_16_;
  local_40 = in_R9;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_44 = SamplerHandle::Get1D(in_stack_fffffffffffff778._8_8_);
  if (local_28 == 0) {
    LightSampleContext::LightSampleContext((LightSampleContext *)auVar35._8_8_,auVar35._0_8_);
    LightSamplerHandle::Sample(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,u_00);
  }
  else {
    pSVar25 = Interaction::AsSurface(auVar35._8_8_);
    LightSampleContext::LightSampleContext(&local_90,pSVar25);
    LightSamplerHandle::Sample(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,u_00);
  }
  PVar28 = SamplerHandle::Get2D(auVar35._0_8_);
  auVar21._8_8_ = extraout_XMM0_Qb;
  auVar21._0_4_ = PVar28.super_Tuple2<pbrt::Point2,_float>.x;
  auVar21._4_4_ = PVar28.super_Tuple2<pbrt::Point2,_float>.y;
  local_c8 = vmovlpd_avx(auVar21);
  bVar24 = pstd::optional::operator_cast_to_bool(local_60);
  if (!bVar24) {
    SampledSpectrum::SampledSpectrum(auVar35._8_8_,auVar35._4_4_);
    local_d8 = 1;
LAB_007eacf4:
    pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x7ead01);
    aVar23.values[2] = (float)(undefined4)local_8;
    aVar23.values[3] = (float)local_8._4_4_;
    aVar23.values[0] = (float)(undefined4)local_10;
    aVar23.values[1] = (float)local_10._4_4_;
    return (array<float,_4>)(array<float,_4>)aVar23.values;
  }
  pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x7e9eb9);
  LightHandle::LightHandle(auVar35._8_8_,auVar35._0_8_);
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ::TaggedPointer(&local_e8,(nullptr_t)0x0);
  bVar24 = TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           ::operator!=(&local_e0,&local_e8);
  if (bVar24) {
    pSVar26 = pstd::optional<pbrt::SampledLight>::operator->
                        ((optional<pbrt::SampledLight> *)0x7e9f25);
    if ((pSVar26->pdf != 0.0) || (NAN(pSVar26->pdf))) {
      LightSampleContext::LightSampleContext(auVar35._8_8_);
      if (local_28 == 0) {
        LightSampleContext::LightSampleContext((LightSampleContext *)auVar35._8_8_,auVar35._0_8_);
        memcpy(&local_118,local_178,0x30);
      }
      else {
        pSVar25 = Interaction::AsSurface(auVar35._8_8_);
        LightSampleContext::LightSampleContext(&local_148,pSVar25);
        memcpy(&local_118,&local_148,0x30);
      }
      pIStack_208 = pIStack_f8;
      pPStack_200 = pPStack_f0;
      uStack_228 = local_118;
      uStack_220 = uStack_110;
      local_218 = uStack_108;
      uStack_210 = uStack_100;
      local_230 = local_c8;
      uVar31 = *local_30;
      uStack_250 = local_30[1];
      uStack_248 = local_30[2];
      args_01 = (char (*) [27])local_30[3];
      fVar41 = (float)uStack_250;
      auVar36._8_8_ = uStack_110;
      auVar36._0_8_ = local_118;
      auVar36._16_8_ = uStack_108;
      auVar36._24_8_ = uStack_100;
      ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = in_stack_fffffffffffff804;
      ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)in_stack_fffffffffffff800;
      ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
           (Interval<float>)in_stack_fffffffffffff808;
      ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
           (Interval<float>)in_stack_fffffffffffff810;
      ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff818;
      ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff818 >> 0x20);
      ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff820;
      ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff824;
      ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff828;
      ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
           (float)(int)((ulong)in_stack_fffffffffffff828 >> 0x20);
      lambda_00.lambda.values._8_8_ = in_stack_fffffffffffff838;
      lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffff830;
      lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffff830 >> 0x20);
      lambda_00.pdf.values[0] = in_stack_fffffffffffff840;
      lambda_00.pdf.values[1] = (float)in_stack_fffffffffffff844;
      lambda_00.pdf.values[2] = (float)in_stack_fffffffffffff848;
      lambda_00.pdf.values[3] = in_stack_fffffffffffff84c;
      local_258 = uVar31;
      pacStack_240 = args_01;
      LightHandle::SampleLi
                ((LightHandle *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),ctx_00
                 ,(Point2f)in_stack_fffffffffffff7e8,lambda_00,in_stack_fffffffffffff7dc);
      bVar24 = LightLiSample::operator_cast_to_bool(&local_1f0);
      if ((bVar24) && (bVar24 = SampledSpectrum::operator_cast_to_bool(auVar36._16_8_), bVar24)) {
        pSVar26 = pstd::optional<pbrt::SampledLight>::operator->
                            ((optional<pbrt::SampledLight> *)0x7ea111);
        local_25c = pSVar26->pdf * local_1f0.pdf;
        local_270 = *local_40;
        local_268 = local_40[1];
        local_27c = *(undefined8 *)(local_20 + 0x1c);
        local_274 = *(undefined4 *)(local_20 + 0x24);
        local_288.x = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.x;
        local_288.y = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.y;
        local_288.z = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        if (local_28 == 0) {
          bVar24 = Interaction::IsMediumInteraction((Interaction *)0x7ea406);
          if (!bVar24) {
            LogFatal<char_const(&)[27]>
                      (in_stack_fffffffffffff7e4,
                       (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                       in_stack_fffffffffffff7d4,in_stack_fffffffffffff7c8,args_01);
          }
          Interaction::AsMedium(auVar36._8_8_);
          PhaseFunctionHandle::PhaseFunctionHandle(auVar36._8_8_,auVar36._0_8_);
          PhaseFunctionHandle::p(pPStack_f0,(Vector3f *)pIStack_f8,auVar36._24_8_);
          SampledSpectrum::operator*=(auVar36._24_8_,auVar36._20_4_);
          local_260 = PhaseFunctionHandle::PDF(pPStack_f0,(Vector3f *)pIStack_f8,auVar36._24_8_);
          this_00 = pIStack_f8;
        }
        else {
          local_2c8.z = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2c8.x = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.x;
          local_2c8.y = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar29 = 0;
          uVar30 = 0;
          local_2e8.z = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2e8.x = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.x;
          local_2e8.y = local_1f0.wi.super_Tuple3<pbrt::Vector3,_float>.y;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff890;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff888;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff888 >> 0x20);
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff870;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff868;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff868 >> 0x20);
          local_2d8 = local_27c;
          local_2d0 = local_274;
          local_2b8 = local_27c;
          local_2b0 = local_274;
          SVar34 = BSDF::f(in_stack_fffffffffffff850,woRender_00,wiRender_00,
                           (TransportMode)in_stack_fffffffffffff84c);
          auVar19._8_8_ = uVar30;
          auVar19._0_8_ = SVar34.values.values._8_8_;
          auVar20._8_8_ = uVar29;
          auVar20._0_8_ = SVar34.values.values._0_8_;
          local_2a8 = vmovlpd_avx(auVar20);
          local_2a0 = vmovlpd_avx(auVar19);
          Interaction::AsSurface(auVar36._8_8_);
          AbsDot<float>(auVar36._8_8_,auVar36._0_8_);
          uVar30 = 0;
          SVar34 = SampledSpectrum::operator*(auVar36._8_8_,auVar36._4_4_);
          auVar35._8_8_ = uVar29;
          auVar35._0_8_ = SVar34.values.values._8_8_;
          auVar18._8_8_ = uVar30;
          auVar18._0_8_ = SVar34.values.values._0_8_;
          local_298 = vmovlpd_avx(auVar18);
          local_290 = vmovlpd_avx(auVar35);
          SampledSpectrum::operator*=(auVar36._24_8_,auVar36._16_8_);
          local_2f0 = local_274;
          local_2f8 = local_27c;
          local_308.z = local_288.z;
          local_308.x = local_288.x;
          local_308.y = local_288.y;
          local_310 = local_274;
          local_318 = local_27c;
          local_328.z = local_288.z;
          local_328.x = local_288.x;
          local_328.y = local_288.y;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff840;
          woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff838;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff820;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff818;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff818 >> 0x20);
          local_260 = BSDF::PDF((BSDF *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800
                                                ),woRender,wiRender,in_stack_fffffffffffff7fc,
                                in_stack_fffffffffffff7f8);
          this_00 = pIStack_f8;
        }
        bVar24 = SampledSpectrum::operator_cast_to_bool(auVar36._16_8_);
        if (bVar24) {
          Interaction::SpawnRayTo
                    ((Interaction *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (Interaction *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
          SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
          SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
          SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
          local_3a0 = local_350;
          local_3a8 = local_358;
          local_3b0 = local_350;
          local_3b8 = local_358;
          args.super_Tuple3<pbrt::Point3,_float>.z = fVar41;
          args.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar31;
          args.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar31 >> 0x20);
          Hash<pbrt::Point3<float>>(args);
          local_3c0 = local_344;
          local_3c8 = local_34c;
          local_3d0 = local_344;
          local_3d8 = local_34c;
          auVar32 = ZEXT464(0);
          args_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
          args_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar31;
          args_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar31 >> 0x20);
          Hash<pbrt::Vector3<float>>(args_00);
          RNG::RNG(auVar36._8_8_,auVar36._0_8_,0x7ea66f);
          do {
            Integrator::Intersect(this_00,auVar36._24_8_,auVar36._20_4_);
            bVar24 = pstd::optional::operator_cast_to_bool(local_4e0);
            if (bVar24) {
              pSVar27 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                  ((optional<pbrt::ShapeIntersection> *)0x7ea6cf);
              bVar24 = pbrt::TaggedPointer::operator_cast_to_bool
                                 ((TaggedPointer *)&(pSVar27->intr).material);
              if (!bVar24) goto LAB_007ea74c;
              SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
              local_d8 = 1;
            }
            else {
LAB_007ea74c:
              TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              ::TaggedPointer(&local_4e8,(nullptr_t)0x0);
              bVar24 = TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                       ::operator!=(local_338,&local_4e8);
              if (bVar24) {
                bVar24 = pstd::optional::operator_cast_to_bool(local_4e0);
                if (bVar24) {
                  pstd::optional<pbrt::ShapeIntersection>::operator->
                            ((optional<pbrt::ShapeIntersection> *)0x7ea7cd);
                }
                auVar22._8_8_ = local_378;
                auVar22._0_8_ = local_368;
                auVar36._16_8_ = local_388;
                auVar36._0_16_ = auVar22;
                auVar36._24_8_ = local_398;
                auVar32 = ZEXT1664(auVar22);
                func.throughput._4_4_ = in_stack_fffffffffffff824;
                func.throughput._0_4_ = in_stack_fffffffffffff820;
                func.pdfLight = (SampledSpectrum *)in_stack_fffffffffffff828;
                func.pdfUni = (SampledSpectrum *)in_stack_fffffffffffff830;
                func.rng = in_stack_fffffffffffff838;
                MediumHandle::
                SampleTmaj<pbrt::VolPathIntegrator::SampleLd(pbrt::Interaction_const&,pbrt::BSDF_const*,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&)const::__0>
                          (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                           in_stack_fffffffffffff804,
                           (RNG *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (SampledWavelengths *)
                           CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),func);
              }
              bVar24 = SampledSpectrum::operator_cast_to_bool(auVar36._16_8_);
              if (bVar24) {
                bVar24 = pstd::optional::operator_cast_to_bool(local_4e0);
                if (bVar24) {
                  pstd::optional<pbrt::ShapeIntersection>::operator->
                            ((optional<pbrt::ShapeIntersection> *)0x7ea917);
                  Interaction::SpawnRayTo
                            ((Interaction *)
                             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                             (Interaction *)
                             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                  Ray::operator=(auVar36._8_8_,auVar36._0_8_);
                  local_d8 = 0;
                }
                else {
                  local_d8 = 3;
                }
              }
              else {
                SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
                local_d8 = 1;
              }
            }
            pstd::optional<pbrt::ShapeIntersection>::~optional
                      ((optional<pbrt::ShapeIntersection> *)0x7ea96f);
            auVar33 = auVar32._8_56_;
          } while (local_d8 == 0);
          if (local_d8 == 3) {
            uVar29 = 0;
            SVar34 = SampledSpectrum::operator*(auVar36._8_8_,auVar36._4_4_);
            auVar32._0_8_ = SVar34.values.values._8_8_;
            auVar32._8_56_ = auVar33;
            uVar31 = auVar33._0_8_;
            auVar17._8_8_ = uVar29;
            auVar17._0_8_ = SVar34.values.values._0_8_;
            vmovlpd_avx(auVar17);
            vmovlpd_avx(auVar32._0_16_);
            SampledSpectrum::operator*=(auVar36._24_8_,auVar36._16_8_);
            type = LightHandle::Type(auVar36._8_8_);
            bVar24 = IsDeltaLight(type);
            auVar39 = auVar36._12_28_;
            auVar37 = auVar36._12_20_;
            if (bVar24) {
              SVar34 = SampledSpectrum::operator*(auVar36._16_8_,auVar36._8_8_);
              auVar35 = auVar37._4_16_;
              auVar15._8_8_ = uVar29;
              auVar15._0_8_ = SVar34.values.values._8_8_;
              auVar16._8_8_ = uVar31;
              auVar16._0_8_ = SVar34.values.values._0_8_;
              vmovlpd_avx(auVar16);
              vmovlpd_avx(auVar15);
              SVar34 = SampledSpectrum::operator*(auVar37._8_8_,auVar37._0_8_);
              auVar40 = auVar35._4_12_;
              auVar13._8_8_ = uVar31;
              auVar13._0_8_ = SVar34.values.values._8_8_;
              auVar14._8_8_ = uVar29;
              auVar14._0_8_ = SVar34.values.values._0_8_;
              vmovlpd_avx(auVar14);
              vmovlpd_avx(auVar13);
              SampledSpectrum::Average(auVar35._0_8_);
              uVar31 = 0;
              SVar34 = SampledSpectrum::operator/(auVar40._4_8_,auVar40._0_4_);
              uStack_76c = (undefined4)((ulong)uVar31 >> 0x20);
              auVar11._8_8_ = uVar29;
              auVar11._0_8_ = SVar34.values.values._8_8_;
              auVar12._8_4_ = (int)uVar31;
              auVar12._0_8_ = SVar34.values.values._0_8_;
              auVar12._12_4_ = uStack_76c;
              local_10 = vmovlpd_avx(auVar12);
              local_8 = vmovlpd_avx(auVar11);
              local_d8 = 1;
            }
            else {
              uVar31 = 0;
              SVar34 = SampledSpectrum::operator*(auVar36._8_8_,auVar36._4_4_);
              uStack_78c = (undefined4)((ulong)uVar31 >> 0x20);
              auVar9._8_8_ = uVar29;
              auVar9._0_8_ = SVar34.values.values._8_8_;
              auVar10._8_4_ = (int)uVar31;
              auVar10._0_8_ = SVar34.values.values._0_8_;
              auVar10._12_4_ = uStack_78c;
              uVar31 = auVar10._8_8_;
              vmovlpd_avx(auVar10);
              vmovlpd_avx(auVar9);
              SampledSpectrum::operator*=(auVar39._12_8_,auVar39._4_8_);
              auVar38 = auVar39._4_24_;
              SVar34 = SampledSpectrum::operator*(auVar39._8_8_,auVar39._0_8_);
              auVar37 = auVar38._4_20_;
              auVar7._8_4_ = (int)uVar31;
              auVar7._0_8_ = SVar34.values.values._8_8_;
              auVar7._12_4_ = (int)((ulong)uVar31 >> 0x20);
              uVar31 = auVar7._8_8_;
              auVar8._8_8_ = uVar29;
              auVar8._0_8_ = SVar34.values.values._0_8_;
              vmovlpd_avx(auVar8);
              vmovlpd_avx(auVar7);
              SVar34 = SampledSpectrum::operator*(auVar38._8_8_,auVar38._0_8_);
              auVar35 = auVar37._4_16_;
              auVar5._8_4_ = (int)uVar29;
              auVar5._0_8_ = SVar34.values.values._8_8_;
              auVar5._12_4_ = (int)((ulong)uVar29 >> 0x20);
              uVar29 = auVar5._8_8_;
              auVar6._8_8_ = uVar31;
              auVar6._0_8_ = SVar34.values.values._0_8_;
              vmovlpd_avx(auVar6);
              vmovlpd_avx(auVar5);
              SVar34 = SampledSpectrum::operator+(auVar37._8_8_,auVar37._0_8_);
              auVar40 = auVar35._4_12_;
              auVar3._8_4_ = (int)uVar31;
              auVar3._0_8_ = SVar34.values.values._8_8_;
              auVar3._12_4_ = (int)((ulong)uVar31 >> 0x20);
              auVar4._8_8_ = uVar29;
              auVar4._0_8_ = SVar34.values.values._0_8_;
              vmovlpd_avx(auVar4);
              vmovlpd_avx(auVar3);
              SampledSpectrum::Average(auVar35._0_8_);
              uVar31 = 0;
              SVar34 = SampledSpectrum::operator/(auVar40._4_8_,auVar40._0_4_);
              uStack_830 = (undefined4)uVar29;
              auVar1._8_4_ = uStack_830;
              auVar1._0_8_ = SVar34.values.values._8_8_;
              auVar1._12_4_ = (int)((ulong)uVar29 >> 0x20);
              auVar2._8_4_ = (int)uVar31;
              auVar2._0_8_ = SVar34.values.values._0_8_;
              auVar2._12_4_ = (int)((ulong)uVar31 >> 0x20);
              local_10 = vmovlpd_avx(auVar2);
              local_8 = vmovlpd_avx(auVar1);
              local_d8 = 1;
            }
          }
        }
        else {
          SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
          local_d8 = 1;
        }
      }
      else {
        SampledSpectrum::SampledSpectrum(auVar36._8_8_,auVar36._4_4_);
        local_d8 = 1;
      }
      goto LAB_007eacf4;
    }
  }
  LogFatal<char_const(&)[43]>
            (in_stack_fffffffffffff7e4,
             (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
             in_stack_fffffffffffff7d4,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &beta,
                                            const SampledSpectrum &pathPDF) const {
    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight =
        bsdf ? lightSampler.Sample(intr.AsSurface(), u) : lightSampler.Sample(intr, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    LightSampleContext ctx;
    if (bsdf)
        ctx = LightSampleContext(intr.AsSurface());
    else
        ctx = LightSampleContext(intr);
    LightLiSample ls = light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls.pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum betaLight = beta;
    Vector3f wo = intr.wo, wi = ls.wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        betaLight *= bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        betaLight *= phase.p(wo, wi);
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!betaLight)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls.pLight);
    SampledSpectrum throughput(1.f), pdfLight(1.f), pdfUni(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (true) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            lightRay.medium.SampleTmaj(
                lightRay, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Account for medium scattering event along shadow ray
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    if (!mediumSample.intr) {
                        // CO                        betaLight *= Tmaj;
                        return false;
                    }
                    const MediumInteraction &intr = *mediumSample.intr;
                    // Update _throughput_ and PDFs using ratio-tracking estimator
                    SampledSpectrum sigma_n = intr.sigma_n();
                    // ratio-tracking: only evaluate null scattering
                    throughput *= Tmaj * sigma_n;
                    pdfLight *= Tmaj * intr.sigma_maj;
                    pdfUni *= Tmaj * sigma_n;

                    Float pSurvive =
                        throughput.MaxComponentValue() / (pdfLight + pdfUni).Average();
                    if (pSurvive < .25f) {
                        if (rng.Uniform<Float>() > pSurvive)
                            throughput = SampledSpectrum(0.);
                        else
                            throughput /= pSurvive;
                    }

                    if (!throughput)
                        return false;
                    rescale(throughput, pdfLight, pdfUni);
                    return true;
                });
        }

        // Generate next ray segment or return final transmittance
        if (!throughput)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls.pLight);
    }
    // Return weighted light contribution to direct lighting
    pdfLight *= pathPDF * lightPDF;  // p_nee in paper
    if (IsDeltaLight(light.Type()))
        // pdfUni unused...
        return betaLight * ls.L * throughput / pdfLight.Average();
    else {
        pdfUni *= pathPDF * scatterPDF;
        return betaLight * ls.L * throughput / (pdfLight + pdfUni).Average();
    }
}